

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
::~Unordered_set_column
          (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
           *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  node_ptr next;
  _Hash_node_base *p_Var4;
  
  for (p_Var4 = (this->column_)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
      p_Var4 = p_Var4->_M_nxt) {
    p_Var1 = p_Var4[1]._M_nxt;
    if (((this->super_Row_access_option).rows_ != (Row_container *)0x0) &&
       (p_Var2 = p_Var1[1]._M_nxt, p_Var2 != (_Hash_node_base *)0x0)) {
      p_Var3 = p_Var1[2]._M_nxt;
      p_Var3->_M_nxt = p_Var2;
      p_Var2[1]._M_nxt = p_Var3;
      p_Var1[1]._M_nxt = (_Hash_node_base *)0x0;
      p_Var1[2]._M_nxt = (_Hash_node_base *)0x0;
    }
    if (p_Var1 != (_Hash_node_base *)0x0) {
      p_Var2 = p_Var1[1]._M_nxt;
      if (p_Var2 != (_Hash_node_base *)0x0) {
        p_Var3 = p_Var1[2]._M_nxt;
        p_Var3->_M_nxt = p_Var2;
        p_Var2[1]._M_nxt = p_Var3;
        p_Var1[1]._M_nxt = (_Hash_node_base *)0x0;
        p_Var1[2]._M_nxt = (_Hash_node_base *)0x0;
      }
      operator_delete(p_Var1,0x20);
    }
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->column_)._M_h);
  return;
}

Assistant:

inline Unordered_set_column<Master_matrix>::~Unordered_set_column()
{
  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }
}